

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::DividedByEqual<float,float>,float,float,false,std::allocator<unsigned_long>>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               View<float,_false,_std::allocator<unsigned_long>_> *w)

{
  float fVar1;
  CoordinateOrder CVar2;
  size_t sVar3;
  size_t sVar4;
  reference pfVar5;
  reference pfVar6;
  reference pfVar7;
  reference pfVar8;
  size_t j_1;
  size_t j_2;
  size_t j;
  ulong dimension;
  bool bVar9;
  const_iterator itW;
  Marray<float,_std::allocator<unsigned_long>_> m;
  const_iterator local_a0;
  undefined1 local_70 [72];
  
  Assert<bool>((w->geometry_).size_ != 0 && (v->geometry_).size_ != 0);
  sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(w);
    bVar9 = sVar3 == sVar4;
  }
  Assert<bool>(bVar9);
  sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 != 0) {
    for (dimension = 0; sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v),
        dimension < sVar3; dimension = dimension + 1) {
      sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,dimension);
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(w,dimension);
      Assert<bool>(sVar3 == sVar4);
    }
  }
  sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 == 0) {
    pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                       ((View<float,false,std::allocator<unsigned_long>> *)w,0);
    fVar1 = *pfVar5;
    local_a0.view_._0_4_ = fVar1;
    bVar9 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(v);
    if (bVar9) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      sVar3 = (v->geometry_).size_;
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        pfVar5[sVar4] = pfVar5[sVar4] / fVar1;
      }
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,pfVar5);
      return;
    }
    View<float,_false,_std::allocator<unsigned_long>_>::begin((iterator *)local_70,v);
    while (bVar9 = Iterator<float,_false,_std::allocator<unsigned_long>_>::hasMore
                             ((iterator *)local_70), bVar9) {
      pfVar7 = Iterator<float,_false,_std::allocator<unsigned_long>_>::operator*
                         ((iterator *)local_70);
      *pfVar7 = *pfVar7 / local_a0.view_._0_4_;
      Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++((iterator *)local_70);
    }
  }
  else {
    bVar9 = View<float,false,std::allocator<unsigned_long>>::
            overlaps<float,false,std::allocator<unsigned_long>>
                      ((View<float,false,std::allocator<unsigned_long>> *)v,w);
    if (bVar9) {
      Marray<float,std::allocator<unsigned_long>>::Marray<float,false,std::allocator<unsigned_long>>
                ((Marray<float,std::allocator<unsigned_long>> *)local_70,w);
      operate<andres::marray_detail::DividedByEqual<float,float>,float,float,false,std::allocator<unsigned_long>>
                (v,(Marray<float,std::allocator<unsigned_long>> *)local_70);
      Marray<float,_std::allocator<unsigned_long>_>::~Marray
                ((Marray<float,_std::allocator<unsigned_long>_> *)local_70);
      return;
    }
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    CVar2 = (v->geometry_).coordinateOrder_;
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
    if (((CVar2 == (w->geometry_).coordinateOrder_) &&
        (bVar9 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(v), bVar9)) &&
       (bVar9 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(w), bVar9)) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      sVar3 = (v->geometry_).size_;
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        pfVar5[sVar4] = pfVar5[sVar4] / pfVar6[sVar4];
      }
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      pfVar5 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)v,0);
      pfVar6 = View<float,false,std::allocator<unsigned_long>>::operator()
                         ((View<float,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,pfVar5,pfVar6);
      return;
    }
    View<float,_false,_std::allocator<unsigned_long>_>::begin((iterator *)local_70,v);
    View<float,_false,_std::allocator<unsigned_long>_>::begin(&local_a0,w);
    while (bVar9 = Iterator<float,_false,_std::allocator<unsigned_long>_>::hasMore
                             ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)local_70),
          bVar9) {
      bVar9 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore(&local_a0);
      Assert<bool>(bVar9);
      pfVar7 = Iterator<float,_false,_std::allocator<unsigned_long>_>::operator*
                         ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)local_70);
      pfVar8 = Iterator<float,_true,_std::allocator<unsigned_long>_>::operator*(&local_a0);
      *pfVar7 = *pfVar7 / *pfVar8;
      Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<float,_false,_std::allocator<unsigned_long>_> *)local_70);
      Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++(&local_a0);
    }
    bVar9 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore(&local_a0);
    Assert<bool>(!bVar9);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_a0 + 0x18));
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_70 + 0x18));
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}